

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall QListViewPrivate::doItemsLayout(QListViewPrivate *this,int delta)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int in_ESI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int last;
  int first;
  QListViewLayoutInfo info;
  int max;
  QListViewPrivate *this_00;
  undefined4 in_stack_ffffffffffffff80;
  bool local_65;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_2c;
  QPersistentModelIndex local_28 [3];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListViewPrivate *)(in_RDI->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
  iVar3 = (**(code **)(*(long *)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate + 0x78))(this_00,local_28);
  local_c = iVar3 - 1;
  iVar4 = batchStartRow(in_RDI);
  local_2c = iVar4 + in_ESI + -1;
  piVar5 = qMin<int>(&local_2c,(int *)&local_c);
  iVar3 = *piVar5;
  if (iVar4 == 0) {
    QAbstractScrollAreaPrivate::layoutChildren((QAbstractScrollAreaPrivate *)this_00);
    prepareItemsLayout((QListViewPrivate *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (((int)local_c < 0) || (iVar3 < iVar4)) {
    local_65 = true;
  }
  else {
    memset(&local_5c,0xaa,0x30);
    QListViewLayoutInfo::QListViewLayoutInfo((QListViewLayoutInfo *)this_00);
    uVar1 = (in_RDI->layoutBounds).x1;
    local_5c = uVar1;
    gridSize(this_00);
    bVar2 = QSize::isValid((QSize *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
    if (!bVar2) {
      spacing(in_RDI);
    }
    isWrapping(in_RDI);
    iVar3 = (*in_RDI->commonListView->_vptr_QCommonListViewBase[4])
                      (in_RDI->commonListView,&local_5c,(ulong)local_c);
    local_65 = (bool)((byte)iVar3 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_65;
}

Assistant:

bool QListViewPrivate::doItemsLayout(int delta)
{
    int max = model->rowCount(root) - 1;
    int first = batchStartRow();
    int last = qMin(first + delta - 1, max);

    if (first == 0) {
        layoutChildren(); // make sure the viewport has the right size
        prepareItemsLayout();
    }

    if (max < 0 || last < first) {
        return true; // nothing to do
    }

    QListViewLayoutInfo info;
    info.bounds = layoutBounds;
    info.grid = gridSize();
    info.spacing = (info.grid.isValid() ? 0 : spacing());
    info.first = first;
    info.last = last;
    info.wrap = isWrapping();
    info.flow = flow;
    info.max = max;

    return commonListView->doBatchedItemLayout(info, max);
}